

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-metadce.cpp
# Opt level: O0

void __thiscall MetaDCEGraph::MetaDCEGraph(MetaDCEGraph *this,Module *wasm)

{
  initializer_list<std::pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1c0;
  allocator<std::pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_177;
  key_equal local_176;
  hasher local_175;
  ModuleItemKind local_174 [10];
  ModuleItemKind local_14c;
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_148;
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  iterator local_28;
  size_type local_20;
  Module *local_18;
  Module *wasm_local;
  MetaDCEGraph *this_local;
  
  local_18 = wasm;
  wasm_local = (Module *)this;
  std::
  unordered_map<wasm::Name,_DCENode,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>_>
  ::unordered_map(&this->nodes);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set(&this->roots);
  std::
  unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::unordered_map(&this->exportToDCENode);
  std::
  unordered_map<std::pair<wasm::ModuleItemKind,_wasm::Name>,_wasm::Name,_std::hash<std::pair<wasm::ModuleItemKind,_wasm::Name>_>,_std::equal_to<std::pair<wasm::ModuleItemKind,_wasm::Name>_>,_std::allocator<std::pair<const_std::pair<wasm::ModuleItemKind,_wasm::Name>,_wasm::Name>_>_>
  ::unordered_map(&this->itemToDCENode);
  std::
  unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::unordered_map(&this->importIdToDCENode);
  this->wasm = local_18;
  local_148 = &local_140;
  local_14c = Function;
  std::
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<wasm::ModuleItemKind,_const_char_(&)[5],_true>(local_148,&local_14c,(char (*) [5])0x1aa766)
  ;
  local_148 = &local_118;
  local_174[5] = 1;
  std::
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<wasm::ModuleItemKind,_const_char_(&)[6],_true>
            (local_148,local_174 + 5,(char (*) [6])"table");
  local_148 = &local_f0;
  local_174[4] = 2;
  std::
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<wasm::ModuleItemKind,_const_char_(&)[7],_true>
            (local_148,local_174 + 4,(char (*) [7])0x1a9a6d);
  local_148 = &local_c8;
  local_174[3] = 3;
  std::
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<wasm::ModuleItemKind,_const_char_(&)[7],_true>
            (local_148,local_174 + 3,(char (*) [7])"global");
  local_148 = &local_a0;
  local_174[2] = 4;
  std::
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<wasm::ModuleItemKind,_const_char_(&)[4],_true>(local_148,local_174 + 2,(char (*) [4])"tag")
  ;
  local_148 = &local_78;
  local_174[1] = 5;
  std::
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<wasm::ModuleItemKind,_const_char_(&)[5],_true>
            (local_148,local_174 + 1,(char (*) [5])"dseg");
  local_148 = &local_50;
  local_174[0] = ElementSegment;
  std::
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<wasm::ModuleItemKind,_const_char_(&)[5],_true>(local_148,local_174,(char (*) [5])"eseg");
  local_28 = &local_140;
  local_20 = 7;
  std::
  allocator<std::pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(&local_177);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::
  unordered_map<wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<wasm::ModuleItemKind>,_std::equal_to<wasm::ModuleItemKind>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->kindPrefixes,__l,0,&local_175,&local_176,&local_177);
  std::
  allocator<std::pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator(&local_177);
  local_1c0 = (pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_28;
  do {
    local_1c0 = local_1c0 + -1;
    std::
    pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_1c0);
  } while (local_1c0 != &local_140);
  this->nameIndex = 0;
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set(&this->reached);
  return;
}

Assistant:

MetaDCEGraph(Module& wasm) : wasm(wasm) {}